

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O0

nng_err nni_http_handler_init_directory(nni_http_handler **hpp,char *uri,char *path)

{
  nng_err nVar1;
  nni_list_node *pnVar2;
  nng_http_handler *pnStack_38;
  nng_err rv;
  nni_http_handler *h;
  http_file *hf;
  char *path_local;
  char *uri_local;
  nni_http_handler **hpp_local;
  
  hf = (http_file *)path;
  path_local = uri;
  uri_local = (char *)hpp;
  h = (nni_http_handler *)nni_zalloc(0x18);
  if (h != (nni_http_handler *)0x0) {
    pnVar2 = (nni_list_node *)nng_strdup((char *)hf);
    (h->node).ln_prev = pnVar2;
    if (pnVar2 != (nni_list_node *)0x0) {
      pnVar2 = (nni_list_node *)nng_strdup(path_local);
      (h->node).ln_next = pnVar2;
      if (pnVar2 != (nni_list_node *)0x0) {
        nVar1 = nni_http_handler_init(&stack0xffffffffffffffc8,path_local,http_handle_dir);
        if (nVar1 == NNG_OK) {
          nng_http_handler_set_tree(pnStack_38);
          nng_http_handler_collect_body(pnStack_38,true,0);
          nng_http_handler_set_data(pnStack_38,h,http_file_free);
          *(nng_http_handler **)uri_local = pnStack_38;
          return NNG_OK;
        }
        http_file_free(h);
        return nVar1;
      }
    }
    http_file_free(h);
  }
  return NNG_ENOMEM;
}

Assistant:

nng_err
nni_http_handler_init_directory(
    nni_http_handler **hpp, const char *uri, const char *path)
{
	http_file        *hf;
	nni_http_handler *h;
	nng_err           rv;

	if ((hf = NNI_ALLOC_STRUCT(hf)) == NULL) {
		return (NNG_ENOMEM);
	}
	if (((hf->path = nng_strdup(path)) == NULL) ||
	    ((hf->base = nng_strdup(uri)) == NULL)) {
		http_file_free(hf);
		return (NNG_ENOMEM);
	}

	if ((rv = nni_http_handler_init(&h, uri, http_handle_dir)) != 0) {
		http_file_free(hf);
		return (rv);
	}
	// We don't permit a body for getting a file.
	nng_http_handler_set_tree(h);
	nng_http_handler_collect_body(h, true, 0);
	nng_http_handler_set_data(h, hf, http_file_free);

	*hpp = h;
	return (NNG_OK);
}